

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.cc
# Opt level: O2

void __thiscall AddrSpaceManager::~AddrSpaceManager(AddrSpaceManager *this)

{
  AddrSpace *pAVar1;
  pointer ppAVar2;
  AddressResolver *pAVar3;
  pointer ppJVar4;
  JoinRecord *this_00;
  int4 i_1;
  int4 i;
  ulong uVar5;
  pointer ppAVar6;
  
  this->_vptr_AddrSpaceManager = (_func_int **)&PTR__AddrSpaceManager_003f0858;
  for (ppAVar6 = (this->baselist).super__Vector_base<AddrSpace_*,_std::allocator<AddrSpace_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      ppAVar6 !=
      (this->baselist).super__Vector_base<AddrSpace_*,_std::allocator<AddrSpace_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppAVar6 = ppAVar6 + 1) {
    pAVar1 = *ppAVar6;
    if (pAVar1 != (AddrSpace *)0x0) {
      if (pAVar1->refcount < 2) {
        (*pAVar1->_vptr_AddrSpace[1])();
      }
      else {
        pAVar1->refcount = pAVar1->refcount + -1;
      }
    }
  }
  uVar5 = 0;
  while( true ) {
    ppAVar2 = (this->resolvelist).
              super__Vector_base<AddressResolver_*,_std::allocator<AddressResolver_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->resolvelist).
                      super__Vector_base<AddressResolver_*,_std::allocator<AddressResolver_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish - (long)ppAVar2 >> 3) <= uVar5)
    break;
    pAVar3 = ppAVar2[uVar5];
    if (pAVar3 != (AddressResolver *)0x0) {
      (*pAVar3->_vptr_AddressResolver[1])();
    }
    uVar5 = uVar5 + 1;
  }
  for (uVar5 = 0;
      ppJVar4 = (this->splitlist).super__Vector_base<JoinRecord_*,_std::allocator<JoinRecord_*>_>.
                _M_impl.super__Vector_impl_data._M_start,
      uVar5 < (ulong)((long)(this->splitlist).
                            super__Vector_base<JoinRecord_*,_std::allocator<JoinRecord_*>_>._M_impl.
                            super__Vector_impl_data._M_finish - (long)ppJVar4 >> 3);
      uVar5 = uVar5 + 1) {
    this_00 = ppJVar4[uVar5];
    if (this_00 != (JoinRecord *)0x0) {
      std::_Vector_base<VarnodeData,_std::allocator<VarnodeData>_>::~_Vector_base
                ((_Vector_base<VarnodeData,_std::allocator<VarnodeData>_> *)this_00);
    }
    operator_delete(this_00);
  }
  std::_Vector_base<JoinRecord_*,_std::allocator<JoinRecord_*>_>::~_Vector_base
            (&(this->splitlist).super__Vector_base<JoinRecord_*,_std::allocator<JoinRecord_*>_>);
  std::
  _Rb_tree<JoinRecord_*,_JoinRecord_*,_std::_Identity<JoinRecord_*>,_JoinRecordCompare,_std::allocator<JoinRecord_*>_>
  ::~_Rb_tree(&(this->splitset)._M_t);
  std::
  _Rb_tree<int,_std::pair<const_int,_AddrSpace_*>,_std::_Select1st<std::pair<const_int,_AddrSpace_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_AddrSpace_*>_>_>
  ::~_Rb_tree(&(this->shortcut2Space)._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AddrSpace_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AddrSpace_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AddrSpace_*>_>_>
  ::~_Rb_tree(&(this->name2Space)._M_t);
  std::_Vector_base<AddressResolver_*,_std::allocator<AddressResolver_*>_>::~_Vector_base
            (&(this->resolvelist).
              super__Vector_base<AddressResolver_*,_std::allocator<AddressResolver_*>_>);
  std::_Vector_base<AddrSpace_*,_std::allocator<AddrSpace_*>_>::~_Vector_base
            (&(this->baselist).super__Vector_base<AddrSpace_*,_std::allocator<AddrSpace_*>_>);
  return;
}

Assistant:

AddrSpaceManager::~AddrSpaceManager(void)

{
  for(vector<AddrSpace *>::iterator iter=baselist.begin();iter!=baselist.end();++iter) {
    AddrSpace *spc = *iter;
    if (spc == (AddrSpace *)0) continue;
    if (spc->refcount > 1)
      spc->refcount -= 1;
    else
      delete spc;
  }
  for(int4 i=0;i<resolvelist.size();++i) {
    if (resolvelist[i] != (AddressResolver *)0)
      delete resolvelist[i];
  }
  for(int4 i=0;i<splitlist.size();++i)
    delete splitlist[i];	// Delete any join records
}